

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void mov_eAXOv(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  int iVar3;
  uint uVar4;
  char (*__src) [8];
  char (*pacVar5) [4];
  ulong MyNumber;
  long lStack_20;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"mov",4);
  (pMyDisasm->Reserved_).MOD_ = 0;
  (pMyDisasm->Reserved_).RM_ = 5;
  iVar3 = (pMyDisasm->Reserved_).AddressSize;
  if (iVar3 == 0x20) {
    iVar3 = Security(5,pMyDisasm);
    if (iVar3 == 0) {
      return;
    }
    MyNumber = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.8X",MyNumber);
    lStack_20 = 5;
  }
  else if (iVar3 == 0x40) {
    iVar3 = Security(9,pMyDisasm);
    if (iVar3 == 0) {
      return;
    }
    MyNumber = *(ulong *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.16llX",MyNumber);
    lStack_20 = 9;
  }
  else {
    iVar3 = Security(3,pMyDisasm);
    if (iVar3 == 0) {
      return;
    }
    MyNumber = (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.4X",MyNumber);
    lStack_20 = 3;
  }
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + lStack_20;
  (pMyDisasm->Operand2).Memory.Displacement = MyNumber;
  UVar1 = (pMyDisasm->Reserved_).REX.B_;
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  if (UVar1 == '\0') {
    (pMyDisasm->Operand1).Registers.gpr = 1;
    iVar3 = (pMyDisasm->Reserved_).OperandSize;
    if (iVar3 == 0x40) {
      pacVar5 = Registers64Bits;
      goto LAB_0010ef25;
    }
    if (iVar3 == 0x20) {
      __src = Registers32Bits;
      goto LAB_0010ef08;
    }
    __src = Registers16Bits;
  }
  else {
    (pMyDisasm->Operand1).Registers.gpr = 0x100;
    iVar3 = (pMyDisasm->Reserved_).OperandSize;
    if (iVar3 == 0x40) {
      pacVar5 = Registers64Bits + 8;
LAB_0010ef25:
      IVar2 = 0x68;
      __src = (char (*) [8])pacVar5;
      goto LAB_0010ef32;
    }
    if (iVar3 == 0x20) {
      __src = Registers32Bits + 8;
LAB_0010ef08:
      IVar2 = 0x67;
      goto LAB_0010ef32;
    }
    __src = Registers16Bits + 8;
  }
  IVar2 = 0x66;
LAB_0010ef32:
  (pMyDisasm->Reserved_).MemDecoration = IVar2;
  strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
  (pMyDisasm->Operand2).OpType = 0x30000;
  uVar4 = (pMyDisasm->Reserved_).MemDecoration - 0x66;
  if (uVar4 < 3) {
    IVar2 = *(Int32 *)(&DAT_00138630 + (ulong)uVar4 * 4);
    (pMyDisasm->Operand1).OpSize = IVar2;
    (pMyDisasm->Operand2).OpSize = IVar2;
  }
  return;
}

Assistant:

void __bea_callspec__ mov_eAXOv(PDISASM pMyDisasm)
{
    UInt64 MyAddress;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mov");
    #endif
    GV.RM_ = 5;
    GV.MOD_= 0;
    if (GV.AddressSize == 64) {
        if (!Security(9, pMyDisasm)) return;
        MyAddress = *((UInt64 *) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.16llX",(Int64) MyAddress);
       #endif
       GV.EIP_+=9;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }
    else if (GV.AddressSize == 32) {
        if (!Security(5, pMyDisasm)) return;
        MyAddress = *((UInt32*) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.8X",(Int64) MyAddress);
       #endif
       GV.EIP_+=5;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }
    else {
        if (!Security(3, pMyDisasm)) return;
        MyAddress = *((UInt16*) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.4X",(Int64) MyAddress);
       #endif
       GV.EIP_+=3;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }

    if (GV.REX.B_ == 0) {
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0;
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
            #endif
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
            #endif
        }
        else {
            GV.MemDecoration = Arg2word;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
            #endif
        }
    }
    else {
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG8;
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0+8]);
            #endif
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0+8]);
            #endif
        }
        else {
            GV.MemDecoration = Arg2word;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0+8]);
            #endif
        }
    }

    pMyDisasm->Operand2.OpType = MEMORY_TYPE ;
    if (GV.MemDecoration == 104) {
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Operand2.OpSize = 64;
    }
    else if (GV.MemDecoration == 103) {
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand2.OpSize = 32;
    }
    else if (GV.MemDecoration == 102) {
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand2.OpSize = 16;
    }

}